

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::resolveReference(Value *this,char *key,char *end)

{
  _Base_ptr p_Var1;
  bool bVar2;
  const_iterator __pos;
  CZString actualKey;
  value_type defaultValue;
  undefined1 local_1b8 [32];
  ValueHolder local_198;
  uint local_190;
  Value local_188 [9];
  
  if (*(char *)&this->bits_ == '\0') {
    Value((Value *)&local_198,objectValue);
    swap((Value *)&local_198,this);
    ~Value((Value *)&local_198);
  }
  else if (*(char *)&this->bits_ != '\a') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198.bool_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,
               "in Json::Value::resolveReference(key, end): requires objectValue",0x40);
    std::__cxx11::stringbuf::str();
    throwLogicError((String *)local_1b8);
  }
  local_1b8._8_4_ = ((int)end - (int)key) * 4 + 2;
  __pos._M_node = &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_1b8._0_8_ = key;
  for (p_Var1 = (((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[bVar2]) {
    bVar2 = CZString::operator<((CZString *)(p_Var1 + 1),(CZString *)local_1b8);
    if (!bVar2) {
      __pos._M_node = p_Var1;
    }
  }
  if (((_Rb_tree_header *)__pos._M_node ==
       &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) ||
     (bVar2 = CZString::operator==((CZString *)(__pos._M_node + 1),(CZString *)local_1b8), !bVar2))
  {
    nullSingleton();
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              ((pair<const_Json::Value::CZString,_Json::Value> *)&local_198,(CZString *)local_1b8,
               &nullSingleton::nullStatic);
    __pos._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
         ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                   ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                     *)(this->value_).map_,__pos,
                    (pair<const_Json::Value::CZString,_Json::Value> *)&local_198);
    ~Value(local_188);
    if ((local_198 != (void *)0x0) && ((local_190 & 3) == 1)) {
      free(local_198.string_);
    }
  }
  if (((char *)local_1b8._0_8_ != (char *)0x0) && ((local_1b8._8_4_ & 3) == 1)) {
    free((void *)local_1b8._0_8_);
  }
  return (Value *)&__pos._M_node[1]._M_left;
}

Assistant:

Value& Value::resolveReference(char const* key, char const* end) {
  JSON_ASSERT_MESSAGE(
      type() == nullValue || type() == objectValue,
      "in Json::Value::resolveReference(key, end): requires objectValue");
  if (type() == nullValue)
    *this = Value(objectValue);
  CZString actualKey(key, static_cast<unsigned>(end - key),
                     CZString::duplicateOnCopy);
  auto it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
}